

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O3

void WebPRescalerImportRowShrink_C(WebPRescaler *wrk,uint8_t *src)

{
  rescaler_t *prVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  
  uVar2 = (ulong)wrk->num_channels;
  if (0 < (long)uVar2) {
    iVar3 = wrk->dst_width * wrk->num_channels;
    uVar4 = 0;
    do {
      if ((int)uVar4 < iVar3) {
        prVar1 = wrk->frow;
        iVar7 = 0;
        uVar6 = 0;
        uVar9 = uVar4 & 0xffffffff;
        uVar8 = uVar4;
        do {
          uVar5 = (uint)uVar6;
          bVar12 = SCARRY4(iVar7,wrk->x_add);
          iVar7 = iVar7 + wrk->x_add;
          if (iVar7 == 0 || bVar12 != iVar7 < 0) {
            uVar11 = 0;
          }
          else {
            lVar10 = 0;
            do {
              iVar7 = iVar7 - wrk->x_sub;
              uVar11 = (uint)src[lVar10 + (int)uVar9];
              uVar5 = (int)uVar6 + (uint)src[lVar10 + (int)uVar9];
              uVar6 = (ulong)uVar5;
              lVar10 = lVar10 + uVar2;
            } while (0 < iVar7);
            uVar9 = (ulong)(uint)((int)uVar9 + (int)lVar10);
          }
          prVar1[uVar8] = wrk->x_sub * uVar5 + uVar11 * iVar7;
          uVar6 = (ulong)wrk->fx_scale * (ulong)-(uVar11 * iVar7) + 0x80000000 >> 0x20;
          uVar8 = uVar8 + uVar2;
        } while ((int)uVar8 < iVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar2);
  }
  return;
}

Assistant:

void WebPRescalerImportRowShrink_C(WebPRescaler* const wrk,
                                   const uint8_t* src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    uint32_t sum = 0;
    int accum = 0;
    while (x_out < x_out_max) {
      uint32_t base = 0;
      accum += wrk->x_add;
      while (accum > 0) {
        accum -= wrk->x_sub;
        assert(x_in < wrk->src_width * x_stride);
        base = src[x_in];
        sum += base;
        x_in += x_stride;
      }
      {        // Emit next horizontal pixel.
        const rescaler_t frac = base * (-accum);
        wrk->frow[x_out] = sum * wrk->x_sub - frac;
        // fresh fractional start for next pixel
        sum = (int)MULT_FIX(frac, wrk->fx_scale);
      }
      x_out += x_stride;
    }
    assert(accum == 0);
  }
}